

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O0

void CbInit(N_Vector c,int is,WebData wdata)

{
  long in_RDX;
  undefined8 in_RDI;
  sunrealtype gu [6];
  sunrealtype *cdata;
  int mxns;
  int ns;
  int jy;
  int jx;
  int iyoff;
  int ioff;
  int ici;
  int i;
  undefined8 local_78 [5];
  undefined8 local_50;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_18 = in_RDX;
  local_40 = N_VGetArrayPointer(in_RDI);
  local_34 = *(int *)(local_18 + 0x40);
  local_38 = *(int *)(local_18 + 0x44);
  for (local_1c = 1; local_1c <= local_34; local_1c = local_1c + 1) {
    local_78[local_1c + -1] = 0;
  }
  local_50 = 0x3ff0000000000000;
  for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
    local_28 = local_38 * local_30;
    for (local_2c = 0; local_2c < 0x14; local_2c = local_2c + 1) {
      local_24 = local_38 * local_30 + local_34 * local_2c;
      for (local_1c = 1; local_1c <= local_34; local_1c = local_1c + 1) {
        local_20 = local_24 + local_1c + -1;
        *(undefined8 *)(local_40 + (long)local_20 * 8) = local_78[local_1c + -1];
      }
    }
  }
  return;
}

Assistant:

static void CbInit(N_Vector c, int is, WebData wdata)
{
  int i, ici, ioff, iyoff, jx, jy, ns, mxns;
  sunrealtype* cdata;

  sunrealtype gu[NS];

  cdata = N_VGetArrayPointer(c);
  ns    = wdata->ns;
  mxns  = wdata->mxns;

  for (i = 1; i <= ns; i++) { gu[i - 1] = ZERO; }
  gu[ISPEC - 1] = ONE;

  for (jy = 0; jy < MY; jy++)
  {
    iyoff = mxns * jy;
    for (jx = 0; jx < MX; jx++)
    {
      ioff = iyoff + ns * jx;
      for (i = 1; i <= ns; i++)
      {
        ici        = ioff + i - 1;
        cdata[ici] = gu[i - 1];
      }
    }
  }
}